

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_ArenaSetAllocatedMessageAndRelease_Test
::TestBody(ExtensionSetTest_ArenaSetAllocatedMessageAndRelease_Test *this)

{
  bool bVar1;
  void *pvVar2;
  ForeignMessage *pFVar3;
  ExtensionSet *this_00;
  pointer *__ptr;
  char *message;
  char *in_R9;
  ForeignMessage *foreign_message;
  Arena arena;
  AssertHelper local_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  AssertHelper local_c8;
  ThreadSafeArena local_c0;
  
  ThreadSafeArena::ThreadSafeArena(&local_c0);
  pvVar2 = Arena::DefaultConstruct<proto2_unittest::TestAllExtensions>((Arena *)&local_c0);
  this_00 = (ExtensionSet *)((long)pvVar2 + 0x10);
  bVar1 = ExtensionSet::Has(this_00,proto2_unittest::optional_foreign_message_extension);
  local_100._M_head_impl._0_1_ = !bVar1;
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_100,
               (AssertionResult *)
               "message->HasExtension(unittest::optional_foreign_message_extension)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x1b8,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
    }
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
  }
  pFVar3 = (ForeignMessage *)operator_new(0x20);
  proto2_unittest::ForeignMessage::ForeignMessage(pFVar3,(Arena *)0x0);
  local_f0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3;
  ExtensionSet::SetAllocatedMessage
            (this_00,proto2_unittest::optional_foreign_message_extension,'\v',(FieldDescriptor *)0x0
             ,(MessageLite *)pFVar3);
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ExtensionSet::MutableMessage
                 (this_00,proto2_unittest::optional_foreign_message_extension,'\v',
                  (MessageLite *)&proto2_unittest::_ForeignMessage_default_instance_,
                  (FieldDescriptor *)0x0);
  testing::internal::CmpHelperEQ<proto2_unittest::ForeignMessage*,proto2_unittest::ForeignMessage*>
            ((internal *)local_e8,"foreign_message",
             "message->MutableExtension( unittest::optional_foreign_message_extension)",
             (ForeignMessage **)&local_f0,(ForeignMessage **)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x1bf,message);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((MessageLite *)local_100._M_head_impl != (MessageLite *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  pFVar3 = (ForeignMessage *)
           ExtensionSet::ReleaseMessage
                     (this_00,proto2_unittest::optional_foreign_message_extension,
                      (MessageLite *)&proto2_unittest::_ForeignMessage_default_instance_);
  if (pFVar3 != (ForeignMessage *)0x0) {
    proto2_unittest::ForeignMessage::~ForeignMessage(pFVar3);
  }
  operator_delete(pFVar3,0x20);
  bVar1 = ExtensionSet::Has(this_00,proto2_unittest::optional_foreign_message_extension);
  local_100._M_head_impl._0_1_ = !bVar1;
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_100,
               (AssertionResult *)
               "message->HasExtension(unittest::optional_foreign_message_extension)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x1c6,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
    }
    if (local_108.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_108.data_ + 8))();
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
  }
  ThreadSafeArena::~ThreadSafeArena(&local_c0);
  return;
}

Assistant:

TEST(ExtensionSetTest, ArenaSetAllocatedMessageAndRelease) {
  Arena arena;
  unittest::TestAllExtensions* message =
      Arena::Create<unittest::TestAllExtensions>(&arena);
  EXPECT_FALSE(
      message->HasExtension(unittest::optional_foreign_message_extension));
  // Add a extension using SetAllocatedExtension
  unittest::ForeignMessage* foreign_message = new unittest::ForeignMessage();
  message->SetAllocatedExtension(unittest::optional_foreign_message_extension,
                                 foreign_message);
  // foreign_message is now owned by the arena.
  EXPECT_EQ(foreign_message, message->MutableExtension(
                                 unittest::optional_foreign_message_extension));

  // Underlying message is copied, and returned.
  unittest::ForeignMessage* released_message =
      message->ReleaseExtension(unittest::optional_foreign_message_extension);
  delete released_message;
  EXPECT_FALSE(
      message->HasExtension(unittest::optional_foreign_message_extension));
}